

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O1

Endpoint * __thiscall
helics::MessageFederateManager::getEndpoint(MessageFederateManager *this,int index)

{
  bool bVar1;
  pthread_rwlock_t *__rwlock;
  undefined1 *puVar2;
  
  bVar1 = (this->mLocalEndpoints).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->mLocalEndpoints).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  puVar2 = invalidEpt;
  if ((-1 < index) && (index < (int)(this->mLocalEndpoints).m_obj.dataStorage.csize)) {
    puVar2 = (undefined1 *)
             ((this->mLocalEndpoints).m_obj.dataStorage.dataptr[(uint)index >> 5] + (index & 0x1f));
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return (Endpoint *)puVar2;
}

Assistant:

const Endpoint& MessageFederateManager::getEndpoint(int index) const
{
    auto sharedEpt = mLocalEndpoints.lock_shared();
    if (isValidIndex(index, *sharedEpt)) {
        return (*sharedEpt)[index];
    }
    return invalidEpt;
}